

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O2

void __thiscall cmCTestCurl::~cmCTestCurl(cmCTestCurl *this)

{
  curl_easy_cleanup((Curl_easy *)this->Curl);
  curl_global_cleanup();
  std::__cxx11::string::~string((string *)&this->HTTPProxy);
  std::__cxx11::string::~string((string *)&this->HTTPProxyAuth);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->HttpHeaders);
  return;
}

Assistant:

cmCTestCurl::~cmCTestCurl()
{
  ::curl_easy_cleanup(this->Curl);
  ::curl_global_cleanup();
}